

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcPolyLoop::~IfcPolyLoop(IfcPolyLoop *this)

{
  void *pvVar1;
  
  *(undefined ***)&this[-1].super_IfcLoop.field_0x40 = &PTR__IfcPolyLoop_00947500;
  *(undefined ***)&(this->super_IfcLoop).super_IfcTopologicalRepresentationItem.field_0x28 =
       &PTR__IfcPolyLoop_009475a0;
  *(undefined ***)&this[-1].field_0x50 = &PTR__IfcPolyLoop_00947528;
  *(undefined ***)&this[-1].field_0x60 = &PTR__IfcPolyLoop_00947550;
  (this->super_IfcLoop).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcPolyLoop_00947578;
  pvVar1 = *(void **)&(this->super_IfcLoop).super_IfcTopologicalRepresentationItem.
                      super_IfcRepresentationItem.
                      super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                      field_0x10;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)&(this->super_IfcLoop).super_IfcTopologicalRepresentationItem.
                                     super_IfcRepresentationItem.
                                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                     .field_0x20 - (long)pvVar1);
  }
  operator_delete(&this[-1].super_IfcLoop.field_0x40,0x70);
  return;
}

Assistant:

IfcPolyLoop() : Object("IfcPolyLoop") {}